

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O1

int __thiscall capnp::TwoPartyServer::listen(TwoPartyServer *this,int __fd,int __n)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  void *pvVar3;
  undefined4 in_register_00000014;
  PromiseArena *pPVar4;
  undefined4 in_register_00000034;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_60;
  OwnPromiseNode local_58;
  _func_int **local_50;
  SourceLocation local_48;
  
  pPVar4 = (PromiseArena *)CONCAT44(in_register_00000014,__n);
  (*(code *)**(undefined8 **)pPVar4->bytes)(&local_60,pPVar4);
  OVar2.ptr = local_60.ptr;
  pPVar1 = ((local_60.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_60.ptr - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty.c++:428:13)>
               ::anon_class_16_2_8321eaef_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d0) = &PTR_destroy_006fce88;
    *(_func_int ***)((long)pvVar3 + 0x3f0) = (_func_int **)CONCAT44(in_register_00000034,__fd);
    *(PromiseArena **)((long)pvVar3 + 0x3f8) = pPVar4;
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    ((local_60.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_60.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty.c++:428:13)>
               ::anon_class_16_2_8321eaef_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006fce88;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)CONCAT44(in_register_00000034,__fd);
    OVar2.ptr[-1].super_PromiseArenaMember.arena = pPVar4;
    OVar2.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_48.function = "then";
  local_48.lineNumber = 0x58b;
  local_48.columnNumber = 0x4c;
  local_58.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_58,&local_48);
  OVar2.ptr = local_58.ptr;
  (this->super_ErrorHandler)._vptr_ErrorHandler = local_50;
  if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_60.ptr;
  if (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_60.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::listen(kj::ConnectionReceiver& listener) {
  return listener.accept()
      .then([this,&listener](kj::Own<kj::AsyncIoStream>&& connection) mutable {
    accept(kj::mv(connection));
    return listen(listener);
  });
}